

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTextureClampTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::SparseTextureClampLookupColorTestCase::verifyLookupTextureData
          (SparseTextureClampLookupColorTestCase *this,Functions *gl,GLint target,GLint format,
          GLuint *texture,GLint level,FunctionToken *funcToken)

{
  string *psVar1;
  pointer __s;
  pointer puVar2;
  GLenum GVar3;
  ostream *poVar4;
  ulong uVar5;
  TestError *this_00;
  int iVar6;
  FunctionToken *this_01;
  string *this_02;
  ulong uVar7;
  undefined1 *puVar8;
  ulong uVar9;
  GLint x;
  ulong uVar10;
  size_type __new_size;
  bool bVar11;
  GLuint verifyTexture;
  GLint depth;
  GLint height;
  GLint width;
  allocator<char> local_6b6;
  allocator<char> local_6b5;
  GLint local_6b4;
  GLint local_6b0;
  int local_6ac;
  SparseTexture2LookupTestCase *local_6a8;
  GLuint fbo;
  ulong local_698;
  Functions *local_690;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vecOutData;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vecExpData;
  string vertex;
  string functionDef;
  string fragment;
  string local_5c0;
  string local_5a0;
  string local_580;
  FunctionToken f;
  ProgramSources sources;
  ShaderProgram program;
  TokenStringsExt s;
  
  puVar8 = &(this->super_SparseTextureClampLookupResidencyTestCase).
            super_SparseTexture2LookupTestCase.super_SparseTexture2CommitmentTestCase.
            super_SparseTextureCommitmentTestCase.field_0x88;
  local_6b4 = format;
  poVar4 = std::operator<<((ostream *)puVar8,"Verify Lookup Color Texture Data [function: ");
  poVar4 = std::operator<<(poVar4,(string *)funcToken);
  poVar4 = std::operator<<(poVar4,", level: ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,level);
  std::operator<<(poVar4,"] - ");
  if (level <= (this->super_SparseTextureClampLookupResidencyTestCase).
               super_SparseTexture2LookupTestCase.super_SparseTexture2CommitmentTestCase.
               super_SparseTextureCommitmentTestCase.mState.levels + -1) {
    SparseTextureUtils::getTextureLevelSize
              (target,&(this->super_SparseTextureClampLookupResidencyTestCase).
                       super_SparseTexture2LookupTestCase.super_SparseTexture2CommitmentTestCase.
                       super_SparseTextureCommitmentTestCase.mState,level,&width,&height,&depth);
    bVar11 = true;
    if ((height != 0 && width != 0) &&
       ((this->super_SparseTextureClampLookupResidencyTestCase).super_SparseTexture2LookupTestCase.
        super_SparseTexture2CommitmentTestCase.super_SparseTextureCommitmentTestCase.mState.minDepth
        <= depth)) {
      if (target == 0x8513) {
        depth = depth * 6;
      }
      vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      vecOutData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      vecOutData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      vecOutData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      __new_size = (size_type)(height * width);
      local_6a8 = (SparseTexture2LookupTestCase *)this;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&vecExpData,__new_size);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&vecOutData,__new_size);
      puVar2 = vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      __s = vecOutData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start;
      memset(vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,0xff,__new_size);
      SparseTexture2LookupTestCase::FunctionToken::FunctionToken(&f,funcToken);
      gl4cts::Texture::Generate(gl,&verifyTexture);
      gl4cts::Texture::Bind(gl,verifyTexture,0xde1);
      gl4cts::Texture::Storage(gl,0xde1,1,0x8229,width,height,depth);
      GVar3 = (*gl->getError)();
      glu::checkError(GVar3,"Texture::Storage",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureClampTests.cpp"
                      ,0x32e);
      local_6b0 = level;
      (*gl->genFramebuffers)(1,&fbo);
      GVar3 = (*gl->getError)();
      glu::checkError(GVar3,"glGenFramebuffers",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureClampTests.cpp"
                      ,0x332);
      (*gl->bindFramebuffer)(0x8d40,fbo);
      GVar3 = (*gl->getError)();
      glu::checkError(GVar3,"glBindFramebuffer",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureClampTests.cpp"
                      ,0x334);
      (*gl->framebufferTexture2D)(0x8d40,0x8ce0,0xde1,verifyTexture,0);
      GVar3 = (*gl->getError)();
      glu::checkError(GVar3,"glFramebufferTexture2D",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureClampTests.cpp"
                      ,0x336);
      (*gl->viewport)(0,0,width,height);
      psVar1 = &s.super_TokenStrings.returnType;
      bVar11 = true;
      uVar10 = 0;
      local_690 = gl;
      while ((int)uVar10 < depth) {
        iVar6 = 0;
        local_698 = uVar10;
        while (iVar6 < (((SparseTextureClampLookupResidencyTestCase *)
                        &local_6a8->super_SparseTexture2CommitmentTestCase)->
                       super_SparseTexture2LookupTestCase).super_SparseTexture2CommitmentTestCase.
                       super_SparseTextureCommitmentTestCase.mState.samples) {
          local_6ac = iVar6;
          memset(__s,0,__new_size);
          gl4cts::Texture::Bind(gl,verifyTexture,0xde1);
          gl4cts::Texture::SubImage(gl,0xde1,0,0,0,0,width,height,0,0x1903,0x1401,__s);
          GVar3 = (*gl->getError)();
          glu::checkError(GVar3,"Texture::SubImage",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureClampTests.cpp"
                          ,0x343);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&vertex,stc_vertex_common,(allocator<char> *)&s);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&fragment,stc_fragment_lookupColor,(allocator<char> *)&s);
          this_01 = &f;
          std::__cxx11::string::string((string *)&local_580,(string *)this_01);
          generateFunctionDef(&functionDef,(SparseTextureClampLookupColorTestCase *)this_01,
                              &local_580);
          std::__cxx11::string::~string((string *)&local_580);
          SparseTexture2LookupTestCase::createLookupShaderTokens
                    (&s,local_6a8,target,local_6b4,local_6b0,local_6ac,&f);
          this_02 = psVar1;
          std::__cxx11::string::string((string *)&local_5a0,(string *)psVar1);
          generateExpectedResult
                    ((string *)&sources,(SparseTextureClampLookupColorTestCase *)this_02,&local_5a0,
                     local_6b0);
          std::__cxx11::string::operator=
                    ((string *)&s.super_TokenStrings.resultExpected,(string *)&sources);
          std::__cxx11::string::~string((string *)&sources);
          std::__cxx11::string::~string((string *)&local_5a0);
          replaceToken("<COORD_TYPE>",s.coordType._M_dataplus._M_p,&vertex);
          replaceToken("<FUNCTION_DEF>",functionDef._M_dataplus._M_p,&fragment);
          replaceToken("<FUNCTION>",f.name._M_dataplus._M_p,&fragment);
          replaceToken("<ARGUMENTS>",f.arguments._M_dataplus._M_p,&fragment);
          replaceToken("<OUTPUT_TYPE>",s.super_TokenStrings.outputType._M_dataplus._M_p,&fragment);
          replaceToken("<INPUT_TYPE>",s.super_TokenStrings.inputType._M_dataplus._M_p,&fragment);
          replaceToken("<SIZE_DEF>",s.sizeDef._M_dataplus._M_p,&fragment);
          replaceToken("<LOD>",s.lod._M_dataplus._M_p,&fragment);
          replaceToken("<LOD_DEF>",s.lodDef._M_dataplus._M_p,&fragment);
          replaceToken("<COORD_TYPE>",s.coordType._M_dataplus._M_p,&fragment);
          replaceToken("<ICOORD_TYPE>",s.coordType._M_dataplus._M_p,&fragment);
          replaceToken("<COORD_DEF>",s.coordDef._M_dataplus._M_p,&fragment);
          replaceToken("<POINT_TYPE>",s.super_TokenStrings.pointType._M_dataplus._M_p,&fragment);
          replaceToken("<POINT_DEF>",s.super_TokenStrings.pointDef._M_dataplus._M_p,&fragment);
          replaceToken("<RETURN_TYPE>",s.super_TokenStrings.returnType._M_dataplus._M_p,&fragment);
          replaceToken("<RESULT_EXPECTED>",s.super_TokenStrings.resultExpected._M_dataplus._M_p,
                       &fragment);
          replaceToken("<EPSILON>",s.super_TokenStrings.epsilon._M_dataplus._M_p,&fragment);
          replaceToken("<SAMPLE_DEF>",s.super_TokenStrings.sampleDef._M_dataplus._M_p,&fragment);
          replaceToken("<REFZ_DEF>",s.refZDef._M_dataplus._M_p,&fragment);
          replaceToken("<POINT_COORD>",s.pointCoord._M_dataplus._M_p,&fragment);
          replaceToken("<COMPONENT_DEF>",s.componentDef._M_dataplus._M_p,&fragment);
          replaceToken("<CUBE_MAP_COORD_DEF>",s.cubeMapCoordDef._M_dataplus._M_p,&fragment);
          replaceToken("<OFFSET_ARRAY_DEF>",s.offsetArrayDef._M_dataplus._M_p,&fragment);
          replaceToken("<FORMAT_DEF>",s.formatDef._M_dataplus._M_p,&fragment);
          replaceToken("<OFFSET_TYPE>",s.offsetType._M_dataplus._M_p,&fragment);
          replaceToken("<NOFFSET_TYPE>",s.nOffsetType._M_dataplus._M_p,&fragment);
          replaceToken("<OFFSET_DIM>",s.offsetDim._M_dataplus._M_p,&fragment);
          de::toString<int>((string *)&sources,&width);
          replaceToken("<TEX_WIDTH>",
                       (GLchar *)
                       sources.sources[0].
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,&fragment);
          std::__cxx11::string::~string((string *)&sources);
          de::toString<int>((string *)&sources,&height);
          replaceToken("<TEX_HEIGHT>",
                       (GLchar *)
                       sources.sources[0].
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,&fragment);
          std::__cxx11::string::~string((string *)&sources);
          de::toString<int>((string *)&sources,&depth);
          replaceToken("<TEX_DEPTH>",
                       (GLchar *)
                       sources.sources[0].
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,&fragment);
          std::__cxx11::string::~string((string *)&sources);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&program,vertex._M_dataplus._M_p,&local_6b5);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_5c0,fragment._M_dataplus._M_p,&local_6b6);
          glu::makeVtxFragSources(&sources,(string *)&program,&local_5c0);
          std::__cxx11::string::~string((string *)&local_5c0);
          std::__cxx11::string::~string((string *)&program);
          glu::ShaderProgram::ShaderProgram
                    (&program,((((SparseTextureClampLookupResidencyTestCase *)
                                &local_6a8->super_SparseTexture2CommitmentTestCase)->
                               super_SparseTexture2LookupTestCase).
                               super_SparseTexture2CommitmentTestCase.
                               super_SparseTextureCommitmentTestCase.super_TestCase.m_context)->
                              m_renderCtx,&sources);
          gl = local_690;
          if (program.m_program.m_info.linkOk == true) {
            (*local_690->useProgram)(program.m_program.m_program);
            GVar3 = (*gl->getError)();
            glu::checkError(GVar3,"glUseProgram",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureClampTests.cpp"
                            ,0x379);
            (*gl->activeTexture)(0x84c0);
            GVar3 = (*gl->getError)();
            glu::checkError(GVar3,"glActiveTexture",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureClampTests.cpp"
                            ,0x37d);
            (*gl->uniform1i)(1,0);
            GVar3 = (*gl->getError)();
            glu::checkError(GVar3,"glUniform1i",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureClampTests.cpp"
                            ,0x37f);
            (*gl->bindTexture)(target,*texture);
            GVar3 = (*gl->getError)();
            glu::checkError(GVar3,"glBindTexture",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureClampTests.cpp"
                            ,0x382);
            (*gl->clear)(0x4100);
            (**(code **)(*(long *)&(((SparseTextureClampLookupResidencyTestCase *)
                                    &local_6a8->super_SparseTexture2CommitmentTestCase)->
                                   super_SparseTexture2LookupTestCase).
                                   super_SparseTexture2CommitmentTestCase.
                                   super_SparseTextureCommitmentTestCase.super_TestCase.
                                   super_TestCase.super_TestNode + 0xa0))
                      (local_6a8,target,local_698,&program);
            gl4cts::Texture::Bind(gl,verifyTexture,0xde1);
            gl4cts::Texture::GetData(gl,0,0xde1,0x1903,0x1401,__s);
            GVar3 = (*gl->getError)();
            glu::checkError(GVar3,"Texture::GetData",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureClampTests.cpp"
                            ,0x389);
            uVar10 = 0;
            uVar7 = 0;
            if (0 < width) {
              uVar7 = (ulong)(uint)width;
            }
            uVar5 = (ulong)(uint)height;
            if (height < 1) {
              uVar5 = uVar10;
            }
            for (uVar9 = 0; uVar9 != uVar5; uVar9 = uVar9 + 1) {
              iVar6 = (int)uVar10;
              for (uVar10 = 0; uVar7 != uVar10; uVar10 = uVar10 + 1) {
                bVar11 = (bool)(bVar11 & puVar2[uVar10 + (long)iVar6] == __s[uVar10 + (long)iVar6]);
              }
              uVar10 = (ulong)(uint)(iVar6 + width);
            }
          }
          else {
            poVar4 = std::operator<<((ostream *)puVar8,
                                     "Shader compilation failed (lookup color) for target: ");
            gl = local_690;
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,target);
            poVar4 = std::operator<<(poVar4,", format: ");
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_6b4);
            poVar4 = std::operator<<(poVar4,", vertexInfoLog: ");
            poVar4 = std::operator<<(poVar4,(string *)
                                            &((*program.m_shaders[0].
                                                super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->m_info).
                                             infoLog);
            poVar4 = std::operator<<(poVar4,", fragmentInfoLog: ");
            poVar4 = std::operator<<(poVar4,(string *)
                                            &((*program.m_shaders[1].
                                                super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->m_info).
                                             infoLog);
            poVar4 = std::operator<<(poVar4,", programInfoLog: ");
            poVar4 = std::operator<<(poVar4,(string *)&program.m_program.m_info);
            poVar4 = std::operator<<(poVar4,", fragmentSource: ");
            poVar4 = std::operator<<(poVar4,fragment._M_dataplus._M_p);
            std::operator<<(poVar4," - ");
            bVar11 = false;
          }
          glu::ShaderProgram::~ShaderProgram(&program);
          glu::ProgramSources::~ProgramSources(&sources);
          SparseTexture2LookupTestCase::TokenStringsExt::~TokenStringsExt(&s);
          std::__cxx11::string::~string((string *)&functionDef);
          std::__cxx11::string::~string((string *)&fragment);
          std::__cxx11::string::~string((string *)&vertex);
          iVar6 = local_6ac + 1;
        }
        uVar10 = (ulong)((int)local_698 + 1);
      }
      (*gl->bindFramebuffer)(0x8d40,0);
      GVar3 = (*gl->getError)();
      glu::checkError(GVar3,"glBindFramebuffer",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureClampTests.cpp"
                      ,0x3a3);
      gl4cts::Texture::Delete(gl,&verifyTexture);
      SparseTexture2LookupTestCase::FunctionToken::~FunctionToken(&f);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&vecOutData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    }
    return bVar11;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Invalid level",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureClampTests.cpp"
             ,0x30a);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

bool SparseTextureClampLookupColorTestCase::verifyLookupTextureData(const Functions& gl, GLint target, GLint format,
																	GLuint& texture, GLint level,
																	FunctionToken& funcToken)
{
	mLog << "Verify Lookup Color Texture Data [function: " << funcToken.name << ", level: " << level << "] - ";

	if (level > mState.levels - 1)
		TCU_FAIL("Invalid level");

	GLint width;
	GLint height;
	GLint depth;
	SparseTextureUtils::getTextureLevelSize(target, mState, level, width, height, depth);

	if (width == 0 || height == 0 || depth < mState.minDepth)
		return true;

	bool result = true;

	if (target == GL_TEXTURE_CUBE_MAP)
		depth = depth * 6;

	GLint texSize = width * height;

	std::vector<GLubyte> vecExpData;
	std::vector<GLubyte> vecOutData;
	vecExpData.resize(texSize);
	vecOutData.resize(texSize);
	GLubyte* exp_data = vecExpData.data();
	GLubyte* out_data = vecOutData.data();

	// Expected data is 255 because
	deMemset(exp_data, 255, texSize);

	// Make token copy to work on
	FunctionToken f = funcToken;

	// Create verifying texture
	GLint  verifyTarget = GL_TEXTURE_2D;
	GLuint verifyTexture;
	Texture::Generate(gl, verifyTexture);
	Texture::Bind(gl, verifyTexture, verifyTarget);
	Texture::Storage(gl, verifyTarget, 1, GL_R8, width, height, depth);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Texture::Storage");

	GLuint fbo;
	gl.genFramebuffers(1, &fbo);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenFramebuffers");
	gl.bindFramebuffer(GL_FRAMEBUFFER, fbo);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer");
	gl.framebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, verifyTarget, verifyTexture, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glFramebufferTexture2D");

	gl.viewport(0, 0, width, height);

	for (GLint z = 0; z < depth; ++z)
	{
		for (int sample = 0; sample < mState.samples; ++sample)
		{
			deMemset(out_data, 0, texSize);

			Texture::Bind(gl, verifyTexture, verifyTarget);
			Texture::SubImage(gl, verifyTarget, 0, 0, 0, 0, width, height, 0, GL_RED, GL_UNSIGNED_BYTE,
							  (GLvoid*)out_data);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Texture::SubImage");

			std::string vertex   = stc_vertex_common;
			std::string fragment = stc_fragment_lookupColor;

			std::string functionDef = generateFunctionDef(f.name);

			// Adjust shader source to texture format
			TokenStringsExt s = createLookupShaderTokens(target, format, level, sample, f);

			// Change expected result as it has to be adjusted to different levels
			s.resultExpected = generateExpectedResult(s.returnType, level);

			replaceToken("<COORD_TYPE>", s.coordType.c_str(), vertex);

			replaceToken("<FUNCTION_DEF>", functionDef.c_str(), fragment);
			replaceToken("<FUNCTION>", f.name.c_str(), fragment);
			replaceToken("<ARGUMENTS>", f.arguments.c_str(), fragment);

			replaceToken("<OUTPUT_TYPE>", s.outputType.c_str(), fragment);
			replaceToken("<INPUT_TYPE>", s.inputType.c_str(), fragment);
			replaceToken("<SIZE_DEF>", s.sizeDef.c_str(), fragment);
			replaceToken("<LOD>", s.lod.c_str(), fragment);
			replaceToken("<LOD_DEF>", s.lodDef.c_str(), fragment);
			replaceToken("<COORD_TYPE>", s.coordType.c_str(), fragment);
			replaceToken("<ICOORD_TYPE>", s.coordType.c_str(), fragment);
			replaceToken("<COORD_DEF>", s.coordDef.c_str(), fragment);
			replaceToken("<POINT_TYPE>", s.pointType.c_str(), fragment);
			replaceToken("<POINT_DEF>", s.pointDef.c_str(), fragment);
			replaceToken("<RETURN_TYPE>", s.returnType.c_str(), fragment);
			replaceToken("<RESULT_EXPECTED>", s.resultExpected.c_str(), fragment);
			replaceToken("<EPSILON>", s.epsilon.c_str(), fragment);
			replaceToken("<SAMPLE_DEF>", s.sampleDef.c_str(), fragment);
			replaceToken("<REFZ_DEF>", s.refZDef.c_str(), fragment);
			replaceToken("<POINT_COORD>", s.pointCoord.c_str(), fragment);
			replaceToken("<COMPONENT_DEF>", s.componentDef.c_str(), fragment);
			replaceToken("<CUBE_MAP_COORD_DEF>", s.cubeMapCoordDef.c_str(), fragment);
			replaceToken("<OFFSET_ARRAY_DEF>", s.offsetArrayDef.c_str(), fragment);
			replaceToken("<FORMAT_DEF>", s.formatDef.c_str(), fragment);
			replaceToken("<OFFSET_TYPE>", s.offsetType.c_str(), fragment);
			replaceToken("<NOFFSET_TYPE>", s.nOffsetType.c_str(), fragment);
			replaceToken("<OFFSET_DIM>", s.offsetDim.c_str(), fragment);

			replaceToken("<TEX_WIDTH>", de::toString(width).c_str(), fragment);
			replaceToken("<TEX_HEIGHT>", de::toString(height).c_str(), fragment);
			replaceToken("<TEX_DEPTH>", de::toString(depth).c_str(), fragment);

			ProgramSources sources = makeVtxFragSources(vertex.c_str(), fragment.c_str());

			// Build and run shader
			ShaderProgram program(m_context.getRenderContext(), sources);
			if (program.isOk())
			{
				gl.useProgram(program.getProgram());
				GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram");

				// Pass input sampler/image to shader
				gl.activeTexture(GL_TEXTURE0);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glActiveTexture");
				gl.uniform1i(1, 0 /* sampler_unit */);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1i");

				gl.bindTexture(target, texture);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture");

				gl.clear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);
				draw(target, z, program);

				Texture::Bind(gl, verifyTexture, verifyTarget);
				Texture::GetData(gl, 0, verifyTarget, GL_RED, GL_UNSIGNED_BYTE, (GLvoid*)out_data);
				GLU_EXPECT_NO_ERROR(gl.getError(), "Texture::GetData");

				//Verify only committed region
				for (GLint y = 0; y < height; ++y)
					for (GLint x = 0; x < width; ++x)
					{
						GLubyte* dataRegion	= exp_data + x + y * width;
						GLubyte* outDataRegion = out_data + x + y * width;
						if (dataRegion[0] != outDataRegion[0])
							result = false;
					}
			}
			else
			{
				mLog << "Shader compilation failed (lookup color) for target: " << target << ", format: " << format
					 << ", vertexInfoLog: " << program.getShaderInfo(SHADERTYPE_VERTEX).infoLog
					 << ", fragmentInfoLog: " << program.getShaderInfo(SHADERTYPE_FRAGMENT).infoLog
					 << ", programInfoLog: " << program.getProgramInfo().infoLog
					 << ", fragmentSource: " << fragment.c_str() << " - ";

				result = false;
			}
		}
	}

	gl.bindFramebuffer(GL_FRAMEBUFFER, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer");

	Texture::Delete(gl, verifyTexture);

	return result;
}